

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

bool __thiscall
ON_RevSurface::GetBBox(ON_RevSurface *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_BoundingBox *this_00;
  ON_Line *this_01;
  ON_Interval *this_02;
  double *pdVar1;
  ON_3dVector *this_03;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  ON_Plane *pOVar8;
  ON_Arc *pOVar9;
  byte bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ON_RevSurface *ptr;
  double t;
  ON_3dPointArray corners;
  ON_Arc arc;
  ON_3dPoint P;
  ON_BoundingBox bbox;
  ON_BoundingBox abox;
  ON_BoundingBox cbox;
  ON_BoundingBox local_1f8;
  ON_RevSurface *local_1c8;
  double *local_1c0;
  double *local_1b8;
  long local_1b0;
  double local_1a8;
  ON_SimpleArray<ON_3dPoint> local_1a0;
  ON_Arc local_188;
  ON_3dPoint local_e8;
  ON_BoundingBox local_c8;
  ON_BoundingBox local_98;
  ON_BoundingBox local_60;
  
  bVar10 = 0;
  this_00 = &this->m_bbox;
  bVar4 = ON_BoundingBox::IsValid(this_00);
  if (!bVar4) {
    ON_BoundingBox::ON_BoundingBox(&local_c8);
    ON_BoundingBox::ON_BoundingBox(&local_60);
    ON_BoundingBox::ON_BoundingBox(&local_98);
    bVar4 = ON_Geometry::GetBoundingBox(&this->m_curve->super_ON_Geometry,&local_60,false);
    if (bVar4) {
      local_1b8 = boxmin;
      ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_1a0);
      ON_BoundingBox::GetCorners(&local_60,(ON_3dPointArray *)&local_1a0);
      pOVar8 = &ON_Plane::World_xy;
      pOVar9 = &local_188;
      for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pOVar9->super_ON_Circle).plane.origin.x = (pOVar8->origin).x;
        pOVar8 = (ON_Plane *)((long)pOVar8 + ((ulong)bVar10 * -2 + 1) * 8);
        pOVar9 = (ON_Arc *)((long)pOVar9 + ((ulong)bVar10 * -2 + 1) * 8);
      }
      local_188.super_ON_Circle.radius = 1.0;
      local_188.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
      local_188.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
      this_01 = &this->m_axis;
      ON_Line::Tangent((ON_3dVector *)&local_1f8,this_01);
      local_188.super_ON_Circle.plane.zaxis.z = local_1f8.m_min.z;
      local_188.super_ON_Circle.plane.zaxis.x = local_1f8.m_min.x;
      local_188.super_ON_Circle.plane.zaxis.y = local_1f8.m_min.y;
      this_02 = &this->m_angle;
      local_1c8 = this;
      local_1c0 = boxmax;
      dVar2 = ON_Interval::operator[](this_02,1);
      dVar3 = ON_Interval::operator[](this_02,0);
      ON_Arc::SetAngleRadians(&local_188,dVar2 - dVar3);
      if (0 < local_1a0.m_count) {
        this_03 = &local_188.super_ON_Circle.plane.xaxis;
        lVar6 = 0;
        lVar7 = 0;
        do {
          pdVar1 = (double *)((long)&(local_1a0.m_a)->x + lVar6);
          local_e8.x = *pdVar1;
          local_e8.y = pdVar1[1];
          local_e8.z = *(double *)((long)&(local_1a0.m_a)->z + lVar6);
          ON_BoundingBox::Set(&local_98,&local_e8,0);
          bVar5 = ON_Line::ClosestPointTo(this_01,&local_e8,&local_1a8);
          if (bVar5) {
            local_1b0 = lVar6;
            ON_Line::PointAt(&local_1f8.m_min,this_01,local_1a8);
            local_188.super_ON_Circle.plane.origin.z = local_1f8.m_min.z;
            local_188.super_ON_Circle.plane.origin.x = local_1f8.m_min.x;
            local_188.super_ON_Circle.plane.origin.y = local_1f8.m_min.y;
            ON_3dPoint::operator-((ON_3dVector *)&local_1f8,&local_e8,(ON_3dPoint *)&local_188);
            local_188.super_ON_Circle.plane.xaxis.z = local_1f8.m_min.z;
            local_188.super_ON_Circle.plane.xaxis.x = local_1f8.m_min.x;
            local_188.super_ON_Circle.plane.xaxis.y = local_1f8.m_min.y;
            ON_BoundingBox::Set(&local_98,(ON_3dPoint *)&local_188,1);
            lVar6 = local_1b0;
            local_188.super_ON_Circle.radius = ON_3dVector::Length(this_03);
            bVar5 = ON_3dVector::Unitize(this_03);
            if ((bVar5) &&
               (dVar2 = ON_3dVector::operator*(this_03,&local_188.super_ON_Circle.plane.zaxis),
               ABS(dVar2) <= 0.0001)) {
              ON_CrossProduct((ON_3dVector *)&local_1f8,&local_188.super_ON_Circle.plane.zaxis,
                              this_03);
              local_188.super_ON_Circle.plane.yaxis.z = local_1f8.m_min.z;
              local_188.super_ON_Circle.plane.yaxis.x = local_1f8.m_min.x;
              local_188.super_ON_Circle.plane.yaxis.y = local_1f8.m_min.y;
              bVar5 = ON_3dVector::Unitize(&local_188.super_ON_Circle.plane.yaxis);
              if (bVar5) {
                ON_Plane::UpdateEquation((ON_Plane *)&local_188);
                dVar2 = ON_Interval::operator[](this_02,0);
                ON_Plane::Rotate((ON_Plane *)&local_188,dVar2,&local_188.super_ON_Circle.plane.zaxis
                                );
                bVar5 = ON_Arc::IsValid(&local_188);
                if (bVar5) {
                  ON_Arc::BoundingBox(&local_1f8,&local_188);
                  local_98.m_max.y = local_1f8.m_max.y;
                  local_98.m_max.z = local_1f8.m_max.z;
                  local_98.m_min.z = local_1f8.m_min.z;
                  local_98.m_max.x = local_1f8.m_max.x;
                  local_98.m_min.x = local_1f8.m_min.x;
                  local_98.m_min.y = local_1f8.m_min.y;
                }
              }
            }
          }
          ON_BoundingBox::Union(&local_c8,&local_98);
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 0x18;
        } while (lVar7 < local_1a0.m_count);
      }
      bVar5 = ON_BoundingBox::IsValid(&local_c8);
      boxmin = local_1b8;
      boxmax = local_1c0;
      if (bVar5) {
        (this->m_bbox).m_max.y = local_c8.m_max.y;
        (this->m_bbox).m_max.z = local_c8.m_max.z;
        (this->m_bbox).m_min.z = local_c8.m_min.z;
        (this->m_bbox).m_max.x = local_c8.m_max.x;
        (this_00->m_min).x = local_c8.m_min.x;
        (this->m_bbox).m_min.y = local_c8.m_min.y;
        bVar4 = true;
      }
      ON_Plane::~ON_Plane((ON_Plane *)&local_188);
      ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_1a0);
      this = local_1c8;
    }
  }
  if (bVar4 == false) {
    return false;
  }
  if (boxmin != (double *)0x0) {
    dVar2 = (this_00->m_min).x;
    if (bGrowBox) {
      if (dVar2 < *boxmin) {
        *boxmin = dVar2;
      }
      dVar2 = (this->m_bbox).m_min.y;
      if (dVar2 < boxmin[1]) {
        boxmin[1] = dVar2;
      }
      dVar2 = (this->m_bbox).m_min.z;
      uVar11 = SUB84(dVar2,0);
      uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
      if (boxmin[2] <= dVar2) goto LAB_005aafb2;
    }
    else {
      *boxmin = dVar2;
      boxmin[1] = (this->m_bbox).m_min.y;
      dVar2 = (this->m_bbox).m_min.z;
      uVar11 = SUB84(dVar2,0);
      uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    boxmin[2] = (double)CONCAT44(uVar12,uVar11);
  }
LAB_005aafb2:
  if (boxmax != (double *)0x0) {
    dVar2 = (this->m_bbox).m_max.x;
    if (bGrowBox) {
      if (*boxmax <= dVar2 && dVar2 != *boxmax) {
        *boxmax = dVar2;
      }
      dVar2 = (this->m_bbox).m_max.y;
      if (boxmax[1] <= dVar2 && dVar2 != boxmax[1]) {
        boxmax[1] = dVar2;
      }
      dVar2 = (this->m_bbox).m_max.z;
      uVar11 = SUB84(dVar2,0);
      uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
      if (dVar2 < boxmax[2] || dVar2 == boxmax[2]) {
        return bVar4;
      }
    }
    else {
      *boxmax = dVar2;
      boxmax[1] = (this->m_bbox).m_max.y;
      dVar2 = (this->m_bbox).m_max.z;
      uVar11 = SUB84(dVar2,0);
      uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    boxmax[2] = (double)CONCAT44(uVar12,uVar11);
  }
  return bVar4;
}

Assistant:

bool ON_RevSurface::GetBBox(    // returns true if successful
       double* boxmin,  // boxmin[dim]
       double* boxmax,  // boxmax[dim]
       bool bGrowBox    // true means grow box
       ) const
{
  bool rc = m_bbox.IsValid();

  if ( !rc )
  {
    ON_BoundingBox bbox, cbox, abox;
    rc = m_curve->GetBoundingBox( cbox );
    if (rc)
    {
      //Dec 16 2010 - Chuck - if the angle range does not include 0, m_curve is not part of the surface.
      //bbox = cbox;

      ON_3dPointArray corners;
      cbox.GetCorners(corners);
      ON_3dPoint P;
      ON_Arc arc;
      arc.plane.zaxis = m_axis.Tangent();
      arc.SetAngleRadians(m_angle[1] - m_angle[0]);
      int i;
      double t;
      for ( i = 0; i < corners.Count(); i++ )
      {
        P = corners[i];
        abox.Set(P,false);
        while( m_axis.ClosestPointTo(P,&t) ) // not a loop - used for flow control
        {
          // If we cannot construct a valid arc, then P and the point on the axis
          // are added to the bounding box.  One case where this happens is when
          // P is on the axis of revolution.  See bug 84354.

          arc.plane.origin = m_axis.PointAt(t);
          arc.plane.xaxis = P-arc.plane.origin;
          abox.Set(arc.plane.origin,true);
          arc.radius = arc.plane.xaxis.Length();
          if ( !arc.plane.xaxis.Unitize() )
            break;
          double dot = arc.plane.xaxis*arc.plane.zaxis;
          if ( fabs(dot) > 0.0001 )
            break; 
          arc.plane.yaxis = ON_CrossProduct(arc.plane.zaxis,arc.plane.xaxis);
          if ( !arc.plane.yaxis.Unitize() )
            break;
          arc.plane.UpdateEquation();
          arc.plane.Rotate( m_angle[0], arc.plane.zaxis );
          if ( !arc.IsValid() )
            break;
          abox = arc.BoundingBox();
          break;
        }
        bbox.Union(abox);
      }

      if ( bbox.IsValid() )
      {
        ON_RevSurface* ptr = const_cast<ON_RevSurface*>(this);
        ptr->m_bbox = bbox;
        rc = true;
      }
    }
  }

  if ( rc )
  {
    if ( boxmin )
    {
      if (bGrowBox){
        if (m_bbox.m_min.x < boxmin[0]) boxmin[0] = m_bbox.m_min.x;
        if (m_bbox.m_min.y < boxmin[1]) boxmin[1] = m_bbox.m_min.y;
        if (m_bbox.m_min.z < boxmin[2]) boxmin[2] = m_bbox.m_min.z;
      }
      else {
        boxmin[0] = m_bbox.m_min.x;
        boxmin[1] = m_bbox.m_min.y;
        boxmin[2] = m_bbox.m_min.z;
      }
    }
    if ( boxmax )
    {
      if (bGrowBox){
        if (m_bbox.m_max.x > boxmax[0]) boxmax[0] = m_bbox.m_max.x;
        if (m_bbox.m_max.y > boxmax[1]) boxmax[1] = m_bbox.m_max.y;
        if (m_bbox.m_max.z > boxmax[2]) boxmax[2] = m_bbox.m_max.z;
      }
      else {
        boxmax[0] = m_bbox.m_max.x;
        boxmax[1] = m_bbox.m_max.y;
        boxmax[2] = m_bbox.m_max.z;
      }
    }
  }

  return rc;
}